

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.h
# Opt level: O1

IRBuiltinFunction * __thiscall
flow::IRProgram::getBuiltinFunction(IRProgram *this,NativeCallback *cb)

{
  vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
  *this_00;
  bool bVar1;
  Signature *pSVar2;
  Signature *pSVar3;
  _Head_base<0UL,_flow::IRBuiltinFunction_*,_false> _Var4;
  undefined7 extraout_var_00;
  tuple<flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_> this_01;
  long lVar5;
  long lVar6;
  bool bVar7;
  __uniq_ptr_impl<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_> local_38;
  undefined7 extraout_var;
  
  this_00 = &this->builtinFunctions_;
  _Var4._M_head_impl =
       (IRBuiltinFunction *)
       (this->builtinFunctions_).
       super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->builtinFunctions_).
                super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)_Var4._M_head_impl;
  bVar7 = lVar6 == 0;
  if (!bVar7) {
    pSVar2 = NativeCallback::signature
                       (*(NativeCallback **)
                         ((long)(((this_00->
                                  super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                super___uniq_ptr_impl<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
                         + 0x48));
    pSVar3 = NativeCallback::signature(cb);
    _Var4._M_head_impl._0_1_ = Signature::operator==(pSVar2,pSVar3);
    _Var4._M_head_impl._1_7_ = extraout_var;
    if (_Var4._M_head_impl._0_1_) {
      lVar5 = 0;
    }
    else {
      lVar5 = 0;
      do {
        bVar7 = (lVar6 >> 3) + -1 == lVar5;
        if (bVar7) goto LAB_00126876;
        pSVar2 = NativeCallback::signature
                           (*(NativeCallback **)
                             ((long)(this_00->
                                    super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[lVar5 + 1]._M_t.
                                    super___uniq_ptr_impl<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
                             + 0x48));
        pSVar3 = NativeCallback::signature(cb);
        bVar1 = Signature::operator==(pSVar2,pSVar3);
        _Var4._M_head_impl = (IRBuiltinFunction *)CONCAT71(extraout_var_00,bVar1);
        lVar5 = lVar5 + 1;
      } while (!bVar1);
    }
    _Var4._M_head_impl =
         *(IRBuiltinFunction **)
          &(this_00->
           super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
           super___uniq_ptr_impl<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
    ;
  }
LAB_00126876:
  if (bVar7) {
    this_01.
    super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
    .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
         )operator_new(0x50);
    IRBuiltinFunction::IRBuiltinFunction
              ((IRBuiltinFunction *)
               this_01.
               super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
               .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl,cb);
    local_38._M_t.
    super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
    .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl =
         (tuple<flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>)
         (tuple<flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>)
         this_01.
         super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
         .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>,std::allocator<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>>>
    ::
    emplace_back<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>>
              ((vector<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>,std::allocator<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>>>
                *)this_00,
               (unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_> *
               )&local_38);
    if ((_Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>)
        local_38._M_t.
        super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
        .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl !=
        (IRBuiltinFunction *)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
                            .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl +
                  8))();
    }
    _Var4._M_head_impl =
         (this->builtinFunctions_).
         super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
         ._M_t.
         super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
         .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl;
  }
  return _Var4._M_head_impl;
}

Assistant:

IRBuiltinFunction* getBuiltinFunction(const NativeCallback& cb) {
    for (size_t i = 0, e = builtinFunctions_.size(); i != e; ++i)
      if (builtinFunctions_[i]->signature() == cb.signature())
        return builtinFunctions_[i].get();

    builtinFunctions_.emplace_back(std::make_unique<IRBuiltinFunction>(cb));
    return builtinFunctions_.back().get();
  }